

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O1

void __thiscall QSizeGrip::mouseMoveEvent(QSizeGrip *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 in_ECX;
  uint uVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  QSize ns;
  QRect local_38;
  QSize local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(e + 0x44) == 1) &&
     (lVar1 = *(long *)&(this->super_QWidget).field_0x8, *(char *)(lVar1 + 0x290) == '\0')) {
    while (uVar4 = (((this->super_QWidget).data)->window_flags).
                   super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.
                   i, (uVar4 & 1) == 0) {
      if (((uVar4 & 0xff) == 0x12) ||
         (this = *(QSizeGrip **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10),
         &this->super_QWidget == (QWidget *)0x0)) break;
    }
    if (*(char *)(lVar1 + 0x27c) == '\x01') {
      bVar2 = QWidget::testAttribute_helper(&this->super_QWidget,WA_WState_ConfigPending);
      if (!bVar2) {
        auVar7 = QEventPoint::globalPosition();
        auVar6._0_8_ = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                       auVar7._8_8_;
        auVar6._8_8_ = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                       auVar7._0_8_;
        auVar6 = minpd(_DAT_0066f5d0,auVar6);
        auVar7._8_8_ = -(ulong)(-2147483648.0 < auVar6._8_8_);
        auVar7._0_8_ = -(ulong)(-2147483648.0 < auVar6._0_8_);
        uVar4 = movmskpd(in_ECX,auVar7);
        iVar3 = (int)auVar6._8_8_;
        if ((uVar4 & 2) == 0) {
          iVar3 = -0x80000000;
        }
        iVar5 = (int)auVar6._0_8_;
        if ((uVar4 & 1) == 0) {
          iVar5 = -0x80000000;
        }
        if ((*(uint *)(lVar1 + 0x278) & 0xfffffffe) == 2) {
          iVar5 = iVar5 - *(int *)(lVar1 + 600);
          if (*(int *)(lVar1 + 0x274) <= iVar5) {
            iVar5 = *(int *)(lVar1 + 0x274);
          }
          iVar5 = (*(int *)(lVar1 + 0x268) - *(int *)(lVar1 + 0x260)) + iVar5;
        }
        else {
          iVar5 = iVar5 - *(int *)(lVar1 + 600);
          if (iVar5 <= *(int *)(lVar1 + 0x274)) {
            iVar5 = *(int *)(lVar1 + 0x274);
          }
          iVar5 = *(int *)(lVar1 + 0x268) - (*(int *)(lVar1 + 0x260) + iVar5);
        }
        if ((*(uint *)(lVar1 + 0x278) & 0xfffffffd) == 0) {
          iVar3 = iVar3 - *(int *)(lVar1 + 0x254);
          if (iVar3 <= *(int *)(lVar1 + 0x270)) {
            iVar3 = *(int *)(lVar1 + 0x270);
          }
          iVar3 = *(int *)(lVar1 + 0x264) - (*(int *)(lVar1 + 0x25c) + iVar3);
        }
        else {
          iVar3 = iVar3 - *(int *)(lVar1 + 0x254);
          if (*(int *)(lVar1 + 0x270) <= iVar3) {
            iVar3 = *(int *)(lVar1 + 0x270);
          }
          iVar3 = (*(int *)(lVar1 + 0x264) - *(int *)(lVar1 + 0x25c)) + iVar3;
        }
        local_28.ht.m_i = iVar5 + 1;
        local_28.wd.m_i = iVar3 + 1;
        local_28 = QLayout::closestAcceptableSize(&this->super_QWidget,&local_28);
        iVar3 = local_28.wd.m_i.m_i + -1;
        uVar4 = *(uint *)(lVar1 + 0x278);
        if ((uVar4 & 0xfffffffe) == 2) {
          if ((uVar4 & 1) == 0) {
            local_38.x2.m_i = *(int *)(lVar1 + 0x264);
            local_38.x1.m_i = local_38.x2.m_i - iVar3;
          }
          else {
            local_38.x1.m_i = *(int *)(lVar1 + 0x25c);
            local_38.x2.m_i = iVar3 + local_38.x1.m_i;
          }
          local_38.y2.m_i = local_28.ht.m_i + -1 + *(int *)(lVar1 + 0x260);
          local_38.y1.m_i = *(int *)(lVar1 + 0x260);
        }
        else {
          if ((uVar4 & 0xfffffffd) == 0) {
            local_38.x2.m_i = *(int *)(lVar1 + 0x264);
            local_38.x1.m_i = local_38.x2.m_i - iVar3;
          }
          else {
            local_38.x1.m_i = *(int *)(lVar1 + 0x25c);
            local_38.x2.m_i = iVar3 + local_38.x1.m_i;
          }
          local_38.y1.m_i = *(int *)(lVar1 + 0x268) - (local_28.ht.m_i + -1);
          local_38.y2.m_i = *(int *)(lVar1 + 0x268);
        }
        QWidget::setGeometry(&this->super_QWidget,&local_38);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QWidget::mouseMoveEvent(&this->super_QWidget,e);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSizeGrip::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QSizeGrip);
    if (e->buttons() != Qt::LeftButton || d->m_platformSizeGrip) {
        QWidget::mouseMoveEvent(e);
        return;
    }

    QWidget* tlw = qt_sizegrip_topLevelWidget(this);
    if (!d->gotMousePress || tlw->testAttribute(Qt::WA_WState_ConfigPending))
        return;

    QPoint np(e->globalPosition().toPoint());

    // Don't extend beyond the available geometry; bound to dyMax and dxMax.
    QSize ns;
    if (d->atBottom())
        ns.rheight() = d->r.height() + qMin(np.y() - d->p.y(), d->dyMax);
    else
        ns.rheight() = d->r.height() - qMax(np.y() - d->p.y(), d->dyMax);

    if (d->atLeft())
        ns.rwidth() = d->r.width() - qMax(np.x() - d->p.x(), d->dxMax);
    else
        ns.rwidth() = d->r.width() + qMin(np.x() - d->p.x(), d->dxMax);

    ns = QLayout::closestAcceptableSize(tlw, ns);

    QPoint p;
    QRect nr(p, ns);
    if (d->atBottom()) {
        if (d->atLeft())
            nr.moveTopRight(d->r.topRight());
        else
            nr.moveTopLeft(d->r.topLeft());
    } else {
        if (d->atLeft())
            nr.moveBottomRight(d->r.bottomRight());
        else
            nr.moveBottomLeft(d->r.bottomLeft());
    }

    tlw->setGeometry(nr);
}